

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::PickElement::forward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  Scalar *pSVar2;
  pointer puVar3;
  ostream *poVar4;
  pointer puVar5;
  uint bid;
  ulong uVar6;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> MStack_48;
  
  if (this->pval == (uint *)0x0) {
    pvVar1 = this->pvals;
    if (pvVar1 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x615,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    puVar5 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)puVar3 - (long)puVar5 >> 2 != (ulong)(fx->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x616,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    for (bid = 0; uVar6 = (ulong)bid, uVar6 < (ulong)((long)puVar3 - (long)puVar5 >> 2);
        bid = bid + 1) {
      Tensor::batch_matrix
                (&MStack_48,
                 *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,bid);
      pSVar2 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&MStack_48,
                            (ulong)(this->pvals->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar6]);
      fx->v[uVar6] = *pSVar2;
      puVar5 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    this_00 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if ((this_00->d).d[0] <= *this->pval) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ")
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*this->pval);
      poVar4 = std::operator<<(poVar4,"from a vector of length ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,((*(xs->
                                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->d).d[0]);
      std::endl<char,std::char_traits<char>>(poVar4);
      abort();
    }
    Tensor::operator*(&MStack_48,this_00);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&MStack_48,(ulong)*this->pval);
    *fx->v = *pSVar2;
  }
  return;
}

Assistant:

void PickElement::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << "from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    auto x = **xs[0];
    fx.v[0] = x(*pval);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    for(unsigned b = 0; b < pvals->size(); ++b) {
      auto x = xs[0]->batch_matrix(b);
      fx.v[b] = x((*pvals)[b]);
    }
  }
#endif
}